

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

ImageT<unsigned_char,_1U> * __thiscall
ImageT<unsigned_char,_1U>::transformColorSpace
          (ImageT<unsigned_char,_1U> *this,TransferFunction *decode,TransferFunction *encode,
          ColorPrimaryTransform *transformPrimaries)

{
  uint32_t uVar1;
  uint32_t uVar2;
  Color *pCVar3;
  uint uVar4;
  float (*pafVar5) [3];
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint32_t comp;
  ulong uVar9;
  float fVar10;
  float extraout_XMM0_Da;
  float fVar11;
  undefined8 extraout_XMM0_Qa;
  undefined8 uVar12;
  undefined8 extraout_XMM0_Qa_00;
  float intensity [3];
  float local_40 [4];
  
  uVar1 = (this->super_Image).height;
  uVar2 = (this->super_Image).width;
  for (uVar7 = 0; uVar7 != uVar1 * uVar2; uVar7 = uVar7 + 1) {
    pCVar3 = this->pixels;
    uVar4 = (*(this->super_Image)._vptr_Image[5])();
    uVar8 = (ulong)uVar4;
    if (2 < uVar4) {
      uVar8 = 3;
    }
    uVar12 = extraout_XMM0_Qa;
    for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      (*decode->_vptr_TransferFunction[1])
                (CONCAT44((int)((ulong)uVar12 >> 0x20),
                          (float)pCVar3[uVar7].field_0.comps[0] * 0.003921569),decode);
      intensity[uVar9] = (float)extraout_XMM0_Qa_00;
      uVar12 = extraout_XMM0_Qa_00;
    }
    if (transformPrimaries != (ColorPrimaryTransform *)0x0) {
      local_40[0] = intensity[0];
      local_40[1] = intensity[1];
      local_40[2] = intensity[2];
      pafVar5 = (float (*) [3])transformPrimaries;
      for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
        fVar10 = 0.0;
        for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
          fVar10 = fVar10 + (*(float (*) [3])*pafVar5)[uVar6] * local_40[uVar6];
        }
        intensity[uVar9] = fVar10;
        pafVar5 = pafVar5 + 1;
      }
    }
    for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      (**encode->_vptr_TransferFunction)((ulong)(uint)intensity[uVar9],encode);
      fVar11 = roundf(extraout_XMM0_Da * 255.0);
      fVar10 = 255.0;
      if (fVar11 <= 255.0) {
        fVar10 = fVar11;
      }
      pCVar3[uVar7].field_0 = SUB41((int)(float)(~-(uint)(fVar11 < 0.0) & (uint)fVar10),0);
    }
  }
  return this;
}

Assistant:

virtual ImageT& transformColorSpace(const TransferFunction& decode, const TransferFunction& encode,
                                        const ColorPrimaryTransform* transformPrimaries) override {
        uint32_t pixelCount = getPixelCount();
        for (uint32_t i = 0; i < pixelCount; ++i) {
            Color& c = pixels[i];
            // Don't transform the alpha component.
            uint32_t components = cclamp(getComponentCount(), 0u, 3u);
            float intensity[3];
            float brightness[3];

            // Decode source transfer function
            for (uint32_t comp = 0; comp < components; comp++) {
                brightness[comp] = (float)(c[comp]) * Color::rcpOne();
                intensity[comp] = decode.decode(brightness[comp]);
            }

            // If needed, transform primaries
            if (transformPrimaries != nullptr) {
                float origIntensity[3] = { intensity[0], intensity[1], intensity[2] };
                for (uint32_t j = 0; j < components; ++j) {
                    intensity[j] = 0.f;
                    for (uint32_t k = 0; k < components; ++k)
                        intensity[j] += transformPrimaries->matrix[j][k] * origIntensity[k];
                }
            }

            // Encode destination transfer function
            for (uint32_t comp = 0; comp < components; comp++) {
                brightness[comp] = encode.encode(intensity[comp]);
                // clamp(value, color::min, color::max) is required as static_cast has platform-specific behaviors
                // and on certain platforms can over or underflow
                c.set(comp, cclamp(
                        roundf(brightness[comp] * static_cast<float>(Color::one())),
                        static_cast<float>(Color::min()),
                        static_cast<float>(Color::max())));
            }
        }
        return *this;
    }